

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O2

TypeDescriptor * __thiscall CallExpr::evaluate(CallExpr *this,SymTab *symTab)

{
  bool bVar1;
  CallStatement *this_00;
  Token TStack_98;
  
  this_00 = (CallStatement *)operator_new(0xe0);
  CallStatement::CallStatement(this_00);
  Token::Token(&TStack_98,&(this->super_ExprNode)._token);
  bVar1 = CallStatement::callFinder(this_00,&TStack_98);
  Token::~Token(&TStack_98);
  if (bVar1) {
    (*(this_00->super_Function).super_Statement._vptr_Statement[1])(this_00,symTab);
  }
  return (TypeDescriptor *)0x0;
}

Assistant:

TypeDescriptor *CallExpr::evaluate(SymTab &symTab) {
    auto *funcFinder = new CallStatement;
    if(funcFinder->callFinder(token()))
        funcFinder->evaluate(symTab);
    return nullptr;
}